

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArrayFeatureType::MergeFrom(ArrayFeatureType *this,ArrayFeatureType *from)

{
  DefaultOptionalValueUnion DVar1;
  int iVar2;
  uint32 uVar3;
  int32 iVar4;
  void *pvVar5;
  LogMessage *pLVar6;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_ShapeRange *this_01;
  ArrayFeatureType_EnumeratedShapes *from_00;
  ArrayFeatureType_ShapeRange *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/FeatureTypes.pb.cc"
               ,0xca2);
    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar6);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar5 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar5 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b2);
    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar6);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar2 = (from->shape_).current_size_;
  if (iVar2 != 0) {
    google::protobuf::RepeatedField<long>::Reserve
              (&this->shape_,iVar2 + (this->shape_).current_size_);
    memcpy(((this->shape_).rep_)->elements + (this->shape_).current_size_,
           ((from->shape_).rep_)->elements,(long)(from->shape_).current_size_ << 3);
    (this->shape_).current_size_ = (this->shape_).current_size_ + (from->shape_).current_size_;
  }
  if (from->datatype_ != 0) {
    this->datatype_ = from->datatype_;
  }
  if (from->_oneof_case_[0] != 0x1f) {
    if (from->_oneof_case_[0] != 0x15) goto LAB_001e3375;
    if (this->_oneof_case_[0] == 0x15) {
      this_00 = (this->ShapeFlexibility_).enumeratedshapes_;
LAB_001e3310:
      from_00 = (from->ShapeFlexibility_).enumeratedshapes_;
    }
    else {
      clear_ShapeFlexibility(this);
      this->_oneof_case_[0] = 0x15;
      this_00 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
      ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(this_00);
      (this->ShapeFlexibility_).enumeratedshapes_ = this_00;
      if (from->_oneof_case_[0] == 0x15) goto LAB_001e3310;
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_00 = (ArrayFeatureType_EnumeratedShapes *)
                &_ArrayFeatureType_EnumeratedShapes_default_instance_;
    }
    ArrayFeatureType_EnumeratedShapes::MergeFrom(this_00,from_00);
    goto LAB_001e3375;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    this_01 = (this->ShapeFlexibility_).shaperange_;
LAB_001e3345:
    from_01 = (from->ShapeFlexibility_).shaperange_;
  }
  else {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    this_01 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(this_01);
    (this->ShapeFlexibility_).shaperange_ = this_01;
    if (from->_oneof_case_[0] == 0x1f) goto LAB_001e3345;
    protobuf_FeatureTypes_2eproto::InitDefaults();
    from_01 = (ArrayFeatureType_ShapeRange *)&_ArrayFeatureType_ShapeRange_default_instance_;
  }
  ArrayFeatureType_ShapeRange::MergeFrom(this_01,from_01);
LAB_001e3375:
  uVar3 = from->_oneof_case_[1];
  if (uVar3 == 0x3d) {
    DVar1 = from->defaultOptionalValue_;
    if (this->_oneof_case_[1] != 0x3d) {
      this->_oneof_case_[1] = 0x3d;
    }
    this->defaultOptionalValue_ = DVar1;
  }
  else if (uVar3 == 0x33) {
    iVar4 = (from->defaultOptionalValue_).intdefaultvalue_;
    if (this->_oneof_case_[1] != 0x33) {
      this->_oneof_case_[1] = 0x33;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar4;
  }
  else if (uVar3 == 0x29) {
    iVar4 = (from->defaultOptionalValue_).intdefaultvalue_;
    if (this->_oneof_case_[1] != 0x29) {
      this->_oneof_case_[1] = 0x29;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar4;
  }
  return;
}

Assistant:

void ArrayFeatureType::MergeFrom(const ArrayFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from.datatype() != 0) {
    set_datatype(from.datatype());
  }
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from.enumeratedshapes());
      break;
    }
    case kShapeRange: {
      mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from.shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      set_intdefaultvalue(from.intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      set_floatdefaultvalue(from.floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      set_doubledefaultvalue(from.doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
}